

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction_const>>
               (DataStream *s,ParamsWrapper<TransactionSerParams,_const_CMutableTransaction> *args)

{
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  uint64_t local_40;
  TransactionSerParams *local_38;
  DataStream *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = (DataStream *)&local_40;
  local_40 = 0;
  local_38 = args->m_params;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CMutableTransaction>
            (args->m_object,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_38,local_38
            );
  WriteCompactSize<DataStream>(s,local_40);
  local_38 = args->m_params;
  local_30 = s;
  SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
            (args->m_object,(ParamsStream<DataStream_&,_TransactionSerParams> *)&local_38,local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}